

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFindPackageCommand::SetModuleVariables(cmFindPackageCommand *this,string *components)

{
  string *__lhs;
  char *val;
  string exact;
  string quietly;
  string ver;
  string components_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  string local_a8 [2];
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)local_a8,"CMAKE_FIND_PACKAGE_NAME",(allocator *)&local_40);
  AddFindDefinition(this,local_a8,(this->Name)._M_dataplus._M_p);
  __lhs = &this->Name;
  std::__cxx11::string::~string((string *)local_a8);
  std::operator+(&local_40,__lhs,"_FIND_COMPONENTS");
  AddFindDefinition(this,&local_40,(components->_M_dataplus)._M_p);
  if (this->Quiet == true) {
    std::__cxx11::string::string((string *)local_a8,(string *)__lhs);
    std::__cxx11::string::append((char *)local_a8);
    AddFindDefinition(this,local_a8,"1");
    std::__cxx11::string::~string((string *)local_a8);
  }
  if (this->Required == true) {
    std::__cxx11::string::string((string *)local_a8,(string *)__lhs);
    std::__cxx11::string::append((char *)local_a8);
    AddFindDefinition(this,local_a8,"1");
    std::__cxx11::string::~string((string *)local_a8);
  }
  if ((this->Version)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_60,(string *)__lhs);
    std::__cxx11::string::append((char *)&local_60);
    AddFindDefinition(this,&local_60,(this->Version)._M_dataplus._M_p);
    sprintf((char *)local_a8,"%u",(ulong)this->VersionMajor);
    std::operator+(&bStack_c8,&local_60,"_MAJOR");
    AddFindDefinition(this,&bStack_c8,(char *)local_a8);
    std::__cxx11::string::~string((string *)&bStack_c8);
    sprintf((char *)local_a8,"%u",(ulong)this->VersionMinor);
    std::operator+(&bStack_c8,&local_60,"_MINOR");
    AddFindDefinition(this,&bStack_c8,(char *)local_a8);
    std::__cxx11::string::~string((string *)&bStack_c8);
    sprintf((char *)local_a8,"%u",(ulong)this->VersionPatch);
    std::operator+(&bStack_c8,&local_60,"_PATCH");
    AddFindDefinition(this,&bStack_c8,(char *)local_a8);
    std::__cxx11::string::~string((string *)&bStack_c8);
    sprintf((char *)local_a8,"%u",(ulong)this->VersionTweak);
    std::operator+(&bStack_c8,&local_60,"_TWEAK");
    AddFindDefinition(this,&bStack_c8,(char *)local_a8);
    std::__cxx11::string::~string((string *)&bStack_c8);
    sprintf((char *)local_a8,"%u",(ulong)this->VersionCount);
    std::operator+(&bStack_c8,&local_60,"_COUNT");
    AddFindDefinition(this,&bStack_c8,(char *)local_a8);
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::string((string *)&bStack_c8,(string *)__lhs);
    std::__cxx11::string::append((char *)&bStack_c8);
    val = "0";
    if (this->VersionExact != false) {
      val = "1";
    }
    AddFindDefinition(this,&bStack_c8,val);
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&((this->super_cmFindCommon).super_cmCommand.Makefile)->FindPackageModuleStack,__lhs);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmFindPackageCommand::SetModuleVariables(const std::string& components)
{
  this->AddFindDefinition("CMAKE_FIND_PACKAGE_NAME", this->Name.c_str());

  // Store the list of components.
  std::string components_var = this->Name + "_FIND_COMPONENTS";
  this->AddFindDefinition(components_var, components.c_str());

  if (this->Quiet) {
    // Tell the module that is about to be read that it should find
    // quietly.
    std::string quietly = this->Name;
    quietly += "_FIND_QUIETLY";
    this->AddFindDefinition(quietly, "1");
  }

  if (this->Required) {
    // Tell the module that is about to be read that it should report
    // a fatal error if the package is not found.
    std::string req = this->Name;
    req += "_FIND_REQUIRED";
    this->AddFindDefinition(req, "1");
  }

  if (!this->Version.empty()) {
    // Tell the module that is about to be read what version of the
    // package has been requested.
    std::string ver = this->Name;
    ver += "_FIND_VERSION";
    this->AddFindDefinition(ver, this->Version.c_str());
    char buf[64];
    sprintf(buf, "%u", this->VersionMajor);
    this->AddFindDefinition(ver + "_MAJOR", buf);
    sprintf(buf, "%u", this->VersionMinor);
    this->AddFindDefinition(ver + "_MINOR", buf);
    sprintf(buf, "%u", this->VersionPatch);
    this->AddFindDefinition(ver + "_PATCH", buf);
    sprintf(buf, "%u", this->VersionTweak);
    this->AddFindDefinition(ver + "_TWEAK", buf);
    sprintf(buf, "%u", this->VersionCount);
    this->AddFindDefinition(ver + "_COUNT", buf);

    // Tell the module whether an exact version has been requested.
    std::string exact = this->Name;
    exact += "_FIND_VERSION_EXACT";
    this->AddFindDefinition(exact, this->VersionExact ? "1" : "0");
  }

  // Push on to the pacakge stack
  this->Makefile->FindPackageModuleStack.push_back(this->Name);
}